

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<TCBPoint>::emplace<TCBPoint>
          (QPodArrayOps<TCBPoint> *this,qsizetype i,TCBPoint *args)

{
  TCBPoint **ppTVar1;
  qsizetype *pqVar2;
  qreal qVar3;
  Data *pDVar4;
  long lVar5;
  qreal qVar6;
  qreal qVar7;
  qreal qVar8;
  qreal qVar9;
  qsizetype qVar10;
  TCBPoint *pTVar11;
  GrowthPosition where;
  
  pDVar4 = (this->super_QArrayDataPointer<TCBPoint>).d;
  if ((pDVar4 != (Data *)0x0) &&
     ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (((this->super_QArrayDataPointer<TCBPoint>).size == i) &&
       (qVar10 = QArrayDataPointer<TCBPoint>::freeSpaceAtEnd
                           (&this->super_QArrayDataPointer<TCBPoint>), qVar10 != 0)) {
      pTVar11 = (this->super_QArrayDataPointer<TCBPoint>).ptr;
      lVar5 = (this->super_QArrayDataPointer<TCBPoint>).size;
      pTVar11[lVar5]._b = args->_b;
      qVar3 = (args->_point).xp;
      qVar6 = (args->_point).yp;
      qVar7 = args->_c;
      pTVar11[lVar5]._t = args->_t;
      (&pTVar11[lVar5]._t)[1] = qVar7;
      pTVar11[lVar5]._point.xp = qVar3;
      pTVar11[lVar5]._point.yp = qVar6;
    }
    else {
      if ((i != 0) ||
         (qVar10 = QArrayDataPointer<TCBPoint>::freeSpaceAtBegin
                             (&this->super_QArrayDataPointer<TCBPoint>), qVar10 == 0))
      goto LAB_0039fef9;
      pTVar11 = (this->super_QArrayDataPointer<TCBPoint>).ptr;
      pTVar11[-1]._b = args->_b;
      qVar3 = (args->_point).xp;
      qVar6 = (args->_point).yp;
      qVar7 = args->_c;
      pTVar11[-1]._t = args->_t;
      pTVar11[-1]._c = qVar7;
      pTVar11[-1]._point.xp = qVar3;
      pTVar11[-1]._point.yp = qVar6;
      ppTVar1 = &(this->super_QArrayDataPointer<TCBPoint>).ptr;
      *ppTVar1 = *ppTVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<TCBPoint>).size;
    *pqVar2 = *pqVar2 + 1;
    return;
  }
LAB_0039fef9:
  qVar3 = args->_b;
  qVar6 = (args->_point).xp;
  qVar7 = (args->_point).yp;
  qVar8 = args->_t;
  qVar9 = args->_c;
  where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<TCBPoint>).size != 0);
  QArrayDataPointer<TCBPoint>::detachAndGrow
            (&this->super_QArrayDataPointer<TCBPoint>,where,1,(TCBPoint **)0x0,
             (QArrayDataPointer<TCBPoint> *)0x0);
  pTVar11 = createHole(this,where,i,1);
  (pTVar11->_point).xp = qVar6;
  (pTVar11->_point).yp = qVar7;
  pTVar11->_t = qVar8;
  pTVar11->_c = qVar9;
  pTVar11->_b = qVar3;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }